

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O2

Vec_Int_t * Ivy_ManDfs(Ivy_Man_t *p)

{
  uint __line;
  void *pvVar1;
  Vec_Int_t *vNodes;
  int iVar2;
  char *__assertion;
  
  if (p->nObjs[4] == 0) {
    for (iVar2 = 0; iVar2 < p->vObjs->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p->vObjs,iVar2);
      if ((pvVar1 != (void *)0x0) && ((*(byte *)((long)pvVar1 + 8) & 0x30) != 0)) {
        __assertion = "!pObj->fMarkA && !pObj->fMarkB";
        __line = 0x5f;
        goto LAB_00641b49;
      }
    }
    vNodes = Vec_IntAlloc(p->nObjs[6] + p->nObjs[5]);
    for (iVar2 = 0; iVar2 < p->vPos->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p->vPos,iVar2);
      Ivy_ManDfs_rec(p,(Ivy_Obj_t *)(*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe),vNodes);
    }
    for (iVar2 = 0; iVar2 < p->vObjs->nSize; iVar2 = iVar2 + 1) {
      pvVar1 = Vec_PtrEntry(p->vObjs,iVar2);
      if (pvVar1 != (void *)0x0) {
        *(byte *)((long)pvVar1 + 8) = *(byte *)((long)pvVar1 + 8) & 0xef;
      }
    }
    if (vNodes->nSize == p->nObjs[6] + p->nObjs[5] + p->nObjs[7]) {
      return vNodes;
    }
    __assertion = "Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p)";
    __line = 0x6a;
  }
  else {
    __assertion = "Ivy_ManLatchNum(p) == 0";
    __line = 0x5c;
  }
LAB_00641b49:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyDfs.c"
                ,__line,"Vec_Int_t *Ivy_ManDfs(Ivy_Man_t *)");
}

Assistant:

Vec_Int_t * Ivy_ManDfs( Ivy_Man_t * p )
{
    Vec_Int_t * vNodes;
    Ivy_Obj_t * pObj;
    int i;
    assert( Ivy_ManLatchNum(p) == 0 );
    // make sure the nodes are not marked
    Ivy_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // collect the nodes
    vNodes = Vec_IntAlloc( Ivy_ManNodeNum(p) );
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    // unmark the collected nodes
//    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
//        Ivy_ObjClearMarkA(pObj);
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    // make sure network does not have dangling nodes
    assert( Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p) );
    return vNodes;
}